

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall
HSimplexNla::debugCheckInvert(HSimplexNla *this,string *message,HighsInt alt_debug_level)

{
  value_type vVar1;
  int iVar2;
  double dVar3;
  HighsDebugStatus HVar4;
  HighsDebugStatus HVar5;
  HighsLogOptions *log_options_;
  undefined8 uVar6;
  reference pvVar7;
  reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  double *pdVar11;
  uint *puVar12;
  int in_EDX;
  size_type sVar13;
  long *in_RDI;
  bool bVar14;
  double dVar15;
  double residual_col_error_norm_1;
  double inverse_error_1;
  double ckValue_1;
  double value_1;
  HighsInt lc_iRow_1;
  double inverse_col_error_norm_1;
  HVector residual_2;
  bool report_row;
  HighsInt iCol_4;
  HighsInt k_1;
  HighsInt iVar;
  HighsInt iCol_3;
  HighsInt iRow_3;
  HighsInt check_row;
  bool test_inverse_btran;
  double residual_col_error_norm;
  double inverse_error;
  double ckValue;
  HighsInt lc_iRow;
  double inverse_col_error_norm;
  HVector residual_1;
  bool report_col;
  HighsInt index_3;
  HighsInt index_2;
  HighsInt k;
  HighsInt iCol_2;
  HighsInt iRow_2;
  HighsInt check_col;
  bool test_inverse_ftran;
  double residual_error_norm;
  double inverse_error_norm;
  string value_adjective;
  HighsInt iEl_1;
  HighsInt iCol_1;
  HighsInt iRow_1;
  bool random_btran_test;
  HighsInt index_1;
  HighsInt index;
  HighsInt iEl;
  HighsInt iCol;
  double value;
  HighsInt iRow;
  HighsRandom random;
  bool report_basis;
  bool random_ftran_test;
  double expected_density;
  HVector residual;
  HVector rhs;
  HVector column;
  bool report;
  HighsOptions *options;
  HighsInt *basic_index;
  vector<double,_std::allocator<double>_> *a_matrix_value;
  vector<int,_std::allocator<int>_> *a_matrix_index;
  vector<int,_std::allocator<int>_> *a_matrix_start;
  HighsInt num_col;
  HighsInt num_row;
  HighsDebugStatus return_status;
  bool force;
  HighsInt use_debug_level;
  undefined4 in_stack_fffffffffffff8b8;
  HighsUInt in_stack_fffffffffffff8bc;
  HVectorBase<double> *in_stack_fffffffffffff8c0;
  HVector *in_stack_fffffffffffff8c8;
  HSimplexNla *in_stack_fffffffffffff8d0;
  HVectorBase<double> *in_stack_fffffffffffff8e0;
  double local_710;
  HVectorBase<double> *in_stack_fffffffffffff8f8;
  HVector *in_stack_fffffffffffff900;
  uint in_stack_fffffffffffff908;
  uint uVar16;
  int in_stack_fffffffffffff90c;
  HSimplexNla *in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff928;
  undefined1 uVar17;
  HVector *in_stack_fffffffffffff930;
  HVector *in_stack_fffffffffffff938;
  HVector *in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff948;
  undefined1 uVar18;
  HSimplexNla *in_stack_fffffffffffff950;
  bool local_695;
  undefined4 in_stack_fffffffffffff978;
  int in_stack_fffffffffffff97c;
  int in_stack_fffffffffffff980;
  value_type in_stack_fffffffffffff988;
  HSimplexNla *in_stack_fffffffffffff990;
  value_type in_stack_fffffffffffff998;
  value_type in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9ac;
  int in_stack_fffffffffffff9b0;
  bool local_609;
  int local_5f4;
  undefined1 local_5d9 [33];
  HSimplexNla *local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  uint local_594;
  HighsLogOptions *local_590;
  undefined1 local_581 [216];
  undefined1 local_4a9 [36];
  byte local_485;
  int local_484;
  int local_480;
  int local_47c;
  int local_478;
  uint local_474;
  uint local_470;
  undefined1 local_46a;
  allocator local_469;
  string local_468 [32];
  double local_448;
  double local_440;
  double local_438;
  uint local_42c;
  HighsLogOptions *local_428;
  allocator local_419;
  string local_418 [215];
  allocator local_341;
  string local_340 [35];
  bool local_31d;
  int local_31c;
  int local_318;
  int local_314;
  uint local_310;
  uint local_30c;
  uint local_308;
  undefined1 local_301;
  double local_300;
  double local_2f8;
  string local_2f0 [36];
  undefined4 local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  undefined1 local_2b9;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  uint local_2ac;
  double local_2a8;
  int local_29c;
  bool local_28a;
  undefined1 local_289;
  undefined8 local_288;
  int local_1bc;
  vector<int,_std::allocator<int>_> local_1b8;
  vector<double,_std::allocator<double>_> avStack_1a0 [2];
  int local_10c;
  vector<int,_std::allocator<int>_> vStack_108;
  undefined1 local_98;
  byte local_59;
  pointer local_58;
  pointer local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  int local_30;
  int local_2c;
  HighsDebugStatus local_28;
  undefined1 local_21;
  int local_20;
  HighsDebugStatus local_4;
  
  local_5f4 = in_EDX;
  if (in_EDX < 0) {
    local_5f4 = *(int *)(in_RDI[3] + 0x15c);
  }
  local_20 = local_5f4;
  if (local_5f4 < 2) {
    local_4 = kNotChecked;
  }
  else {
    local_21 = *(int *)(in_RDI[3] + 0x15c) < in_EDX;
    if ((bool)local_21) {
      highsLogDev((HighsLogOptions *)(in_RDI[3] + 0x380),kInfo,"CheckNlaINVERT:   Forcing debug\n");
    }
    local_28 = 0;
    local_2c = *(int *)(*in_RDI + 4);
    local_30 = *(int *)*in_RDI;
    local_38 = (vector<int,_std::allocator<int>_> *)(*in_RDI + 0x90);
    local_40 = (vector<int,_std::allocator<int>_> *)(*in_RDI + 0xc0);
    local_48 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0xd8);
    local_50 = (pointer)in_RDI[2];
    local_58 = (pointer)in_RDI[3];
    local_59 = local_58[0x82] != 0;
    log_options_ = (HighsLogOptions *)(local_58 + 0xe0);
    uVar6 = std::__cxx11::string::c_str();
    highsLogDev(log_options_,kInfo,"\nCheckINVERT: %s\n",uVar6);
    HVectorBase<double>::HVectorBase(in_stack_fffffffffffff8c0);
    HVectorBase<double>::HVectorBase(in_stack_fffffffffffff8c0);
    HVectorBase<double>::setup
              ((HVectorBase<double> *)in_stack_fffffffffffff8d0,
               (HighsInt)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
    HVectorBase<double>::setup
              ((HVectorBase<double> *)in_stack_fffffffffffff8d0,
               (HighsInt)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
    HVectorBase<double>::HVectorBase(in_stack_fffffffffffff8c0);
    local_288 = 0x3ff0000000000000;
    local_289 = 1;
    local_609 = 1 < local_58[0x82] && local_2c < 0x14;
    local_28a = local_609;
    HighsRandom::HighsRandom((HighsRandom *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    HVectorBase<double>::clear(in_stack_fffffffffffff8e0);
    HVectorBase<double>::clear(in_stack_fffffffffffff8e0);
    local_10c = -1;
    if ((local_28a & 1U) != 0) {
      highsLogDev((HighsLogOptions *)(in_RDI[3] + 0x380),kInfo,"Basis:");
    }
    for (local_29c = 0; iVar2 = local_29c, local_29c < local_2c; local_29c = local_29c + 1) {
      sVar13 = (size_type)local_1bc;
      local_1bc = local_1bc + 1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_1b8,sVar13);
      *pvVar7 = iVar2;
      dVar15 = HighsRandom::fraction((HighsRandom *)in_stack_fffffffffffff8d0);
      local_2a8 = dVar15;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10,
                          (long)local_29c);
      *pvVar8 = dVar15;
      local_2ac = local_50[local_29c];
      if ((local_28a & 1U) != 0) {
        highsLogDev((HighsLogOptions *)(in_RDI[3] + 0x380),kInfo," %1d",(ulong)local_2ac);
      }
      dVar15 = local_2a8;
      if ((int)local_2ac < local_30) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)(int)local_2ac);
        for (local_2b0 = *pvVar9; iVar2 = local_2b0,
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_38,(long)(int)(local_2ac + 1)), iVar2 < *pvVar9;
            local_2b0 = local_2b0 + 1) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_40,(long)local_2b0);
          dVar3 = local_2a8;
          local_2b4 = *pvVar9;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_48,(long)local_2b0);
          dVar15 = *pvVar10;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (avStack_1a0,(long)local_2b4);
          *pvVar8 = dVar3 * dVar15 + *pvVar8;
        }
      }
      else {
        local_2b8 = local_2ac - local_30;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (avStack_1a0,(long)local_2b8);
        *pvVar8 = dVar15 + *pvVar8;
      }
    }
    if ((local_28a & 1U) != 0) {
      highsLogDev((HighsLogOptions *)(in_RDI[3] + 0x380),kInfo,"\n");
    }
    HVectorBase<double>::operator=
              (in_stack_fffffffffffff8c0,
               (HVectorBase<double> *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8))
    ;
    ftran(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,(double)in_stack_fffffffffffff8c0,
          (HighsTimerClock *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    HVar4 = debugReportInvertSolutionError
                      (in_stack_fffffffffffff950,SUB81((ulong)in_stack_fffffffffffff948 >> 0x38,0),
                       in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930
                       ,SUB81((ulong)in_stack_fffffffffffff928 >> 0x38,0));
    local_2b9 = 1;
    local_28 = HVar4;
    HVectorBase<double>::clear(in_stack_fffffffffffff8e0);
    local_2c0 = 0;
    while( true ) {
      uVar18 = (undefined1)((ulong)in_stack_fffffffffffff948 >> 0x38);
      uVar17 = (undefined1)((ulong)in_stack_fffffffffffff928 >> 0x38);
      if (local_2c <= local_2c0) break;
      sVar13 = (size_type)local_1bc;
      in_stack_fffffffffffff9b0 = local_2c0;
      local_1bc = local_1bc + 1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_1b8,sVar13);
      *pvVar7 = in_stack_fffffffffffff9b0;
      local_2c4 = local_50[local_2c0];
      if (local_2c4 < local_30) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_2c4);
        local_2c8 = *pvVar9;
        while (in_stack_fffffffffffff9ac = local_2c8,
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (local_38,(long)(local_2c4 + 1)),
              in_stack_fffffffffffff9ac < *pvVar9) {
          in_stack_fffffffffffff990 = (HSimplexNla *)&stack0xffffffffffffff10;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_40,(long)local_2c8);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff990,
                              (long)*pvVar9);
          in_stack_fffffffffffff998 = *pvVar8;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_48,(long)local_2c8);
          in_stack_fffffffffffff9a0 = *pvVar10;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (avStack_1a0,(long)local_2c0);
          *pvVar8 = in_stack_fffffffffffff998 * in_stack_fffffffffffff9a0 + *pvVar8;
          local_2c8 = local_2c8 + 1;
        }
      }
      else {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10,
                            (long)(local_2c4 - local_30));
        in_stack_fffffffffffff988 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (avStack_1a0,(long)local_2c0);
        *pvVar8 = in_stack_fffffffffffff988 + *pvVar8;
      }
      local_2c0 = local_2c0 + 1;
    }
    HVectorBase<double>::operator=
              (in_stack_fffffffffffff8c0,
               (HVectorBase<double> *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8))
    ;
    btran(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,(double)in_stack_fffffffffffff8c0,
          (HighsTimerClock *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    HVar5 = debugReportInvertSolutionError
                      (in_stack_fffffffffffff950,(bool)uVar18,in_stack_fffffffffffff940,
                       in_stack_fffffffffffff938,in_stack_fffffffffffff930,(bool)uVar17);
    local_28 = HVar5;
    if (local_20 < 3) {
      local_2cc = 1;
      local_4 = HVar5;
    }
    else {
      std::__cxx11::string::string(local_2f0);
      local_288 = 0;
      local_2f8 = 0.0;
      local_300 = 0.0;
      local_301 = 1;
      local_308 = 0xffffffff;
      for (local_30c = 0; (int)local_30c < local_2c; local_30c = local_30c + 1) {
        local_310 = local_50[(int)local_30c];
        HVectorBase<double>::clear(in_stack_fffffffffffff8e0);
        local_98 = 1;
        if ((int)local_310 < local_30) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)(int)local_310)
          ;
          local_314 = *pvVar9;
          while (in_stack_fffffffffffff980 = local_314,
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (local_38,(long)(int)(local_310 + 1)),
                in_stack_fffffffffffff980 < *pvVar9) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_40,(long)local_314);
            local_318 = *pvVar9;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (local_48,(long)local_314);
            vVar1 = *pvVar10;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10,
                                (long)local_318);
            *pvVar8 = vVar1;
            in_stack_fffffffffffff97c = local_318;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_108,(long)local_10c)
            ;
            *pvVar7 = in_stack_fffffffffffff97c;
            local_314 = local_314 + 1;
            local_10c = local_10c + 1;
          }
        }
        else {
          local_31c = local_310 - local_30;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10,
                              (long)local_31c);
          iVar2 = local_31c;
          *pvVar8 = 1.0;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_108,(long)local_10c);
          *pvVar7 = iVar2;
          local_10c = local_10c + 1;
        }
        bVar14 = (local_59 & 1) != 0;
        local_695 = bVar14 && local_30c == local_308;
        local_31d = local_695;
        if (bVar14 && local_30c == local_308) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_340,"Check col before FTRAN",&local_341);
          reportArray(in_stack_fffffffffffff910,
                      (string *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                      in_stack_fffffffffffff900,SUB81((ulong)in_stack_fffffffffffff8f8 >> 0x38,0));
          std::__cxx11::string::~string(local_340);
          std::allocator<char>::~allocator((allocator<char> *)&local_341);
        }
        HVectorBase<double>::HVectorBase(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
        ftran(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,(double)in_stack_fffffffffffff8c0,
              (HighsTimerClock *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
        if ((local_31d & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_418,"Check col after  FTRAN",&local_419);
          reportArray(in_stack_fffffffffffff910,
                      (string *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                      in_stack_fffffffffffff900,SUB81((ulong)in_stack_fffffffffffff8f8 >> 0x38,0));
          std::__cxx11::string::~string(local_418);
          std::allocator<char>::~allocator((allocator<char> *)&local_419);
        }
        local_428 = (HighsLogOptions *)0x0;
        for (local_42c = 0; (int)local_42c < local_2c; local_42c = local_42c + 1) {
          local_438 = 1.0;
          if (local_42c != local_30c) {
            local_438 = 0.0;
          }
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10,
                              (long)(int)local_42c);
          local_440 = (double)((ulong)(*pvVar8 - local_438) & (ulong)DAT_008704e0);
          pdVar11 = std::max<double>(&local_440,(double *)&local_428);
          local_428 = (HighsLogOptions *)*pdVar11;
        }
        if ((local_31d & 1U) != 0) {
          highsLogDev(local_428,(HighsLogType)(local_58 + 0xe0),(char *)0x1,
                      "CheckINVERT: Basic column %2d = %2d has inverse error %11.4g\n",
                      (ulong)local_30c,(ulong)local_310);
        }
        pdVar11 = std::max<double>((double *)&local_428,&local_2f8);
        local_2f8 = *pdVar11;
        local_448 = debugInvertResidualError
                              (in_stack_fffffffffffff990,
                               SUB81((ulong)in_stack_fffffffffffff988 >> 0x38,0),
                               (HVector *)CONCAT44(HVar5,in_stack_fffffffffffff980),
                               (HVector *)
                               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        pdVar11 = std::max<double>(&local_448,&local_300);
        local_300 = *pdVar11;
        HVectorBase<double>::~HVectorBase(in_stack_fffffffffffff8c0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_468,"inverse",&local_469);
      local_28 = debugReportInvertSolutionError
                           ((HSimplexNla *)CONCAT44(HVar4,in_stack_fffffffffffff9b0),
                            (string *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                            SUB81((ulong)in_stack_fffffffffffff9a0 >> 0x38,0),
                            in_stack_fffffffffffff998,(double)in_stack_fffffffffffff990,
                            SUB81((ulong)in_stack_fffffffffffff988 >> 0x38,0));
      std::__cxx11::string::~string(local_468);
      std::allocator<char>::~allocator((allocator<char> *)&local_469);
      local_46a = 1;
      local_470 = 0xfffffffe;
      local_2f8 = 0.0;
      local_300 = 0.0;
      local_474 = 0;
      while( true ) {
        uVar18 = (undefined1)((ulong)in_stack_fffffffffffff9a0 >> 0x38);
        uVar17 = (undefined1)((ulong)in_stack_fffffffffffff988 >> 0x38);
        if (local_2c <= (int)local_474) break;
        HVectorBase<double>::clear(in_stack_fffffffffffff8e0);
        local_98 = 1;
        uVar16 = in_stack_fffffffffffff908;
        for (local_478 = 0; local_478 < local_2c; local_478 = local_478 + 1) {
          local_47c = local_50[local_478];
          if (local_47c < local_30) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_47c);
            for (local_480 = *pvVar9; iVar2 = local_480,
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (local_38,(long)(local_47c + 1)), iVar2 < *pvVar9;
                local_480 = local_480 + 1) {
              puVar12 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                          (local_40,(long)local_480);
              if (*puVar12 == local_474) {
                pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (local_48,(long)local_480);
                in_stack_fffffffffffff910 = (HSimplexNla *)*pvVar10;
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)
                                    &stack0xffffffffffffff10,(long)local_478);
                *pvVar8 = (value_type)in_stack_fffffffffffff910;
                break;
              }
            }
          }
          else if (local_47c == local_30 + local_474) {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10,
                                (long)local_478);
            *pvVar8 = 1.0;
          }
        }
        for (local_484 = 0; local_484 < local_2c; local_484 = local_484 + 1) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10,
                              (long)local_484);
          if ((*pvVar8 != 0.0) || (NAN(*pvVar8))) {
            in_stack_fffffffffffff90c = local_484;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_108,(long)local_10c)
            ;
            *pvVar7 = in_stack_fffffffffffff90c;
            local_10c = local_10c + 1;
          }
        }
        in_stack_fffffffffffff908 = uVar16 & 0xffffff;
        if ((local_59 & 1) != 0) {
          in_stack_fffffffffffff908 = CONCAT13(local_474 == local_470,(int3)uVar16);
        }
        local_485 = (byte)(in_stack_fffffffffffff908 >> 0x18);
        if (local_485 != 0) {
          in_stack_fffffffffffff900 = (HVector *)local_4a9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_4a9 + 1),"Check col before BTRAN",
                     (allocator *)in_stack_fffffffffffff900);
          reportArray(in_stack_fffffffffffff910,
                      (string *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                      in_stack_fffffffffffff900,SUB81((ulong)in_stack_fffffffffffff8f8 >> 0x38,0));
          std::__cxx11::string::~string((string *)(local_4a9 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_4a9);
        }
        HVectorBase<double>::HVectorBase(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
        btran(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,(double)in_stack_fffffffffffff8c0,
              (HighsTimerClock *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
        if ((local_485 & 1) != 0) {
          in_stack_fffffffffffff8f8 = (HVectorBase<double> *)local_581;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_581 + 1),"Check col after  BTRAN",
                     (allocator *)in_stack_fffffffffffff8f8);
          reportArray(in_stack_fffffffffffff910,
                      (string *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                      in_stack_fffffffffffff900,SUB81((ulong)in_stack_fffffffffffff8f8 >> 0x38,0));
          std::__cxx11::string::~string((string *)(local_581 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_581);
        }
        local_590 = (HighsLogOptions *)0x0;
        for (local_594 = 0; (int)local_594 < local_2c; local_594 = local_594 + 1) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10,
                              (long)(int)local_594);
          local_5a0 = *pvVar8;
          local_710 = 1.0;
          if (local_594 != local_474) {
            local_710 = 0.0;
          }
          local_5a8 = local_710;
          local_5b0 = (double)((ulong)(local_5a0 - local_710) & (ulong)DAT_008704e0);
          in_stack_fffffffffffff8e0 =
               (HVectorBase<double> *)std::max<double>(&local_5b0,(double *)&local_590);
          local_590 = *(HighsLogOptions **)in_stack_fffffffffffff8e0;
        }
        if ((local_485 & 1) != 0) {
          highsLogDev(local_590,(HighsLogType)(local_58 + 0xe0),(char *)0x1,
                      "CheckINVERT: Basis matrix row %2d has inverse error %11.4g\n",
                      (ulong)local_474);
        }
        pdVar11 = std::max<double>((double *)&local_590,&local_2f8);
        local_2f8 = *pdVar11;
        in_stack_fffffffffffff8d0 =
             (HSimplexNla *)
             debugInvertResidualError
                       (in_stack_fffffffffffff990,SUB81((ulong)in_stack_fffffffffffff988 >> 0x38,0),
                        (HVector *)CONCAT44(HVar5,in_stack_fffffffffffff980),
                        (HVector *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        local_5b8 = in_stack_fffffffffffff8d0;
        in_stack_fffffffffffff8c8 = (HVector *)std::max<double>((double *)&local_5b8,&local_300);
        local_300 = *(double *)in_stack_fffffffffffff8c8;
        HVectorBase<double>::~HVectorBase(in_stack_fffffffffffff8c0);
        local_474 = local_474 + 1;
      }
      in_stack_fffffffffffff8c0 = (HVectorBase<double> *)local_5d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_5d9 + 1),"inverse",(allocator *)in_stack_fffffffffffff8c0);
      local_28 = debugReportInvertSolutionError
                           ((HSimplexNla *)CONCAT44(HVar4,in_stack_fffffffffffff9b0),
                            (string *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                            (bool)uVar18,in_stack_fffffffffffff998,(double)in_stack_fffffffffffff990
                            ,(bool)uVar17);
      std::__cxx11::string::~string((string *)(local_5d9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_5d9);
      local_4 = local_28;
      local_2cc = 1;
      std::__cxx11::string::~string(local_2f0);
    }
    HVectorBase<double>::~HVectorBase(in_stack_fffffffffffff8c0);
    HVectorBase<double>::~HVectorBase(in_stack_fffffffffffff8c0);
    HVectorBase<double>::~HVectorBase(in_stack_fffffffffffff8c0);
  }
  return local_4;
}

Assistant:

HighsDebugStatus HSimplexNla::debugCheckInvert(
    const std::string message, const HighsInt alt_debug_level) const {
  // Sometimes a value other than highs_debug_level is passed as
  // alt_debug_level, either to force debugging, or to limit
  // debugging. If no value is passed, then alt_debug_level = -1, and
  // highs_debug_level is used
  const HighsInt use_debug_level = alt_debug_level >= 0
                                       ? alt_debug_level
                                       : this->options_->highs_debug_level;
  if (use_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  // If highs_debug_level isn't being used, then indicate that it's
  // being forced, and also force reporting of OK errors
  const bool force = alt_debug_level > this->options_->highs_debug_level;
  if (force)
    highsLogDev(this->options_->log_options, HighsLogType::kInfo,
                "CheckNlaINVERT:   Forcing debug\n");

  HighsDebugStatus return_status = HighsDebugStatus::kNotChecked;
  return_status = HighsDebugStatus::kOk;

  const HighsInt num_row = this->lp_->num_row_;
  const HighsInt num_col = this->lp_->num_col_;
  const vector<HighsInt>& a_matrix_start = this->lp_->a_matrix_.start_;
  const vector<HighsInt>& a_matrix_index = this->lp_->a_matrix_.index_;
  const vector<double>& a_matrix_value = this->lp_->a_matrix_.value_;
  const HighsInt* basic_index = this->basic_index_;
  const HighsOptions* options = this->options_;
  // Make sure that this isn't called between the matrix and LP resizing
  assert(num_row == this->lp_->a_matrix_.num_row_);
  assert(num_col == this->lp_->a_matrix_.num_col_);
  const bool report = (options->log_dev_level != 0);

  highsLogDev(options->log_options, HighsLogType::kInfo, "\nCheckINVERT: %s\n",
              message.c_str());

  HVector column;
  HVector rhs;
  column.setup(num_row);
  rhs.setup(num_row);
  HVector residual;
  double expected_density = 1;

  const bool random_ftran_test = true;
  const bool report_basis = options->log_dev_level > 1 && num_row < 20;
  if (random_ftran_test) {
    // Solve for a random solution
    HighsRandom random(1);
    // Solve Bx=b
    column.clear();
    rhs.clear();
    column.count = -1;
    if (report_basis)
      highsLogDev(options_->log_options, HighsLogType::kInfo, "Basis:");
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      rhs.index[rhs.count++] = iRow;
      double value = random.fraction();
      column.array[iRow] = value;
      HighsInt iCol = basic_index[iRow];
      if (report_basis)
        highsLogDev(options_->log_options, HighsLogType::kInfo, " %1d",
                    (int)iCol);
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          HighsInt index = a_matrix_index[iEl];
          rhs.array[index] += value * a_matrix_value[iEl];
        }
      } else {
        HighsInt index = iCol - num_col;
        assert(index < num_row);
        rhs.array[index] += value;
      }
    }
    if (report_basis)
      highsLogDev(options_->log_options, HighsLogType::kInfo, "\n");
    residual = rhs;
    //  if (options->log_dev_level) {
    //    reportArray("Random solution before FTRAN", &column, true);
    //    reportArray("Random RHS      before FTRAN", &rhs, true);
    //  }
    this->ftran(rhs, expected_density);

    return_status =
        debugReportInvertSolutionError(false, column, rhs, residual, force);
  }

  const bool random_btran_test = true;
  if (random_btran_test) {
    // Solve B^Tx=b
    rhs.clear();
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      rhs.index[rhs.count++] = iRow;
      HighsInt iCol = basic_index[iRow];
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          rhs.array[iRow] +=
              column.array[a_matrix_index[iEl]] * a_matrix_value[iEl];
        }
      } else {
        rhs.array[iRow] += column.array[iCol - num_col];
      }
    }
    residual = rhs;
    this->btran(rhs, expected_density);

    return_status =
        debugReportInvertSolutionError(true, column, rhs, residual, force);
  }

  if (use_debug_level < kHighsDebugLevelExpensive) return return_status;

  std::string value_adjective;
  expected_density = 0;
  double inverse_error_norm = 0;
  double residual_error_norm = 0;
  const bool test_inverse_ftran = true;
  if (test_inverse_ftran) {
    // Solve BX=B
    HighsInt check_col = -1;
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      HighsInt iCol = basic_index[iRow];
      column.clear();
      column.packFlag = true;
      if (iCol < num_col) {
        for (HighsInt k = a_matrix_start[iCol]; k < a_matrix_start[iCol + 1];
             k++) {
          HighsInt index = a_matrix_index[k];
          column.array[index] = a_matrix_value[k];
          column.index[column.count++] = index;
        }
      } else {
        HighsInt index = iCol - num_col;
        column.array[index] = 1.0;
        column.index[column.count++] = index;
      }
      const bool report_col = report && iRow == check_col;
      if (report_col) {
        reportArray("Check col before FTRAN", &column, true);
        //      factor_.reportLu(kReportLuBoth, true);
      }
      HVector residual = column;
      this->ftran(column, expected_density);
      if (report_col) reportArray("Check col after  FTRAN", &column, true);
      double inverse_col_error_norm = 0;
      for (HighsInt lc_iRow = 0; lc_iRow < num_row; lc_iRow++) {
        double ckValue = lc_iRow == iRow ? 1 : 0;
        double inverse_error = fabs(column.array[lc_iRow] - ckValue);
        inverse_col_error_norm =
            std::max(inverse_error, inverse_col_error_norm);
      }
      // Extra printing of intermediate errors
      if (report_col)
        highsLogDev(
            options->log_options, HighsLogType::kInfo,
            "CheckINVERT: Basic column %2d = %2d has inverse error %11.4g\n",
            (int)iRow, int(iCol), inverse_col_error_norm);
      inverse_error_norm = std::max(inverse_col_error_norm, inverse_error_norm);
      double residual_col_error_norm =
          debugInvertResidualError(false, column, residual);
      residual_error_norm =
          std::max(residual_col_error_norm, residual_error_norm);
    }
    return_status = debugReportInvertSolutionError(
        "inverse", false, inverse_error_norm, residual_error_norm, force);
  }

  const bool test_inverse_btran = true;
  if (test_inverse_btran) {
    // Solve B^TX=B^T
    HighsInt check_row = -2;
    inverse_error_norm = 0;
    residual_error_norm = 0;
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      column.clear();
      column.packFlag = true;
      for (HighsInt iCol = 0; iCol < num_row; iCol++) {
        HighsInt iVar = basic_index[iCol];
        if (iVar < num_col) {
          for (HighsInt k = a_matrix_start[iVar]; k < a_matrix_start[iVar + 1];
               k++) {
            if (a_matrix_index[k] == iRow) {
              column.array[iCol] = a_matrix_value[k];
              break;
            }
          }
        } else {
          if (iVar == num_col + iRow) column.array[iCol] = 1.0;
        }
      }
      for (HighsInt iCol = 0; iCol < num_row; iCol++) {
        if (column.array[iCol]) column.index[column.count++] = iCol;
      }
      const bool report_row = report && iRow == check_row;
      if (report_row) {
        reportArray("Check col before BTRAN", &column, true);
        //      factor_.reportLu(kReportLuBoth, true);
      }
      HVector residual = column;
      this->btran(column, expected_density);
      if (report_row) reportArray("Check col after  BTRAN", &column, true);
      double inverse_col_error_norm = 0;
      for (HighsInt lc_iRow = 0; lc_iRow < num_row; lc_iRow++) {
        double value = column.array[lc_iRow];
        double ckValue = lc_iRow == iRow ? 1 : 0;
        double inverse_error = fabs(value - ckValue);
        inverse_col_error_norm =
            std::max(inverse_error, inverse_col_error_norm);
      }
      // Extra printing of intermediate errors
      if (report_row)
        highsLogDev(
            options->log_options, HighsLogType::kInfo,
            "CheckINVERT: Basis matrix row %2d has inverse error %11.4g\n",
            (int)iRow, inverse_col_error_norm);
      inverse_error_norm = std::max(inverse_col_error_norm, inverse_error_norm);
      double residual_col_error_norm =
          debugInvertResidualError(true, column, residual);
      residual_error_norm =
          std::max(residual_col_error_norm, residual_error_norm);
    }
    return_status = debugReportInvertSolutionError(
        "inverse", true, inverse_error_norm, residual_error_norm, force);
  }

  return return_status;
}